

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

int PystringSet_Convert(PyObject *py_strings,xmlChar ***result)

{
  ulong uVar1;
  uint uVar2;
  xmlChar **__s;
  Py_ssize_t *pPVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  undefined8 uVar9;
  size_t __n;
  long lVar10;
  uint local_38;
  
  uVar1 = py_strings->ob_type->tp_flags;
  if ((uVar1 & 0x6000000) == 0) {
    if (py_strings == (PyObject *)&_Py_NoneStruct) {
      *result = (xmlChar **)0x0;
      return 0;
    }
  }
  else {
    uVar7 = py_strings[1].ob_refcnt;
    iVar6 = (int)uVar7;
    __n = (long)iVar6 << 3;
    __s = (xmlChar **)(*_xmlMalloc)(__n);
    if (__s == (xmlChar **)0x0) {
      pcVar8 = "";
      uVar9 = _PyExc_MemoryError;
      goto LAB_0013ef30;
    }
    uVar5 = 0;
    memset(__s,0,__n);
    uVar7 = uVar7 & 0xffffffff;
    if (iVar6 < 1) {
      uVar7 = uVar5;
    }
    lVar10 = 0;
    while( true ) {
      if (uVar7 * 8 == uVar5) {
        *result = __s;
        return 0;
      }
      local_38 = (uint)uVar1;
      uVar2 = (uint)py_strings->ob_type->tp_flags;
      if ((local_38 >> 0x1a & 1) == 0) {
        if ((uVar2 >> 0x19 & 1) == 0) {
          __assert_fail("PyList_Check(py_strings)",
                        "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                        ,0xce7,"int PystringSet_Convert(PyObject *, xmlChar ***)");
        }
        pPVar3 = &((py_strings[1].ob_type)->ob_base).ob_base.ob_refcnt + lVar10;
      }
      else {
        if ((uVar2 >> 0x1a & 1) == 0) {
          __assert_fail("PyTuple_Check(py_strings)",
                        "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                        ,0xce6,"int PystringSet_Convert(PyObject *, xmlChar ***)");
        }
        pPVar3 = (Py_ssize_t *)((long)&py_strings[1].ob_type + uVar5);
      }
      lVar4 = PyBytes_AsString(*pPVar3);
      if (lVar4 == 0) break;
      lVar10 = lVar10 + 1;
      *(long *)((long)__s + uVar5) = lVar4;
      uVar5 = uVar5 + 8;
    }
    (*_xmlFree)(__s);
  }
  pcVar8 = "must be a tuple or list of strings.";
  uVar9 = _PyExc_TypeError;
LAB_0013ef30:
  PyErr_SetString(uVar9,pcVar8);
  return -1;
}

Assistant:

static int
PystringSet_Convert(PyObject *py_strings, xmlChar *** result)
{
    /* NOTE: the array should be freed, but the strings are shared
       with the python strings and so must not be freed. */

    xmlChar ** strings;
    int is_tuple = 0;
    int count;
    int init_index = 0;

    if (PyTuple_Check(py_strings))
        is_tuple = 1;
    else if (PyList_Check(py_strings))
        is_tuple = 0;
    else if (py_strings == Py_None) {
        *result = NULL;
        return 0;
    }
    else {
        PyErr_SetString(PyExc_TypeError,
                        "must be a tuple or list of strings.");
        return -1;
    }

    count = (is_tuple
             ? PyTuple_GET_SIZE(py_strings)
             : PyList_GET_SIZE(py_strings));

    strings = (xmlChar **) xmlMalloc(sizeof(xmlChar *) * count);

    if (strings == NULL) {
        PyErr_SetString(PyExc_MemoryError, "");
        return -1;
    }

    memset(strings, 0 , sizeof(xmlChar *) * count);

    {
        int idx;
        for (idx=0; idx < count; ++idx) {
            char* s = PyBytes_AsString
                (is_tuple
                 ? PyTuple_GET_ITEM(py_strings, idx)
                 : PyList_GET_ITEM(py_strings, idx));
            if (s)
                strings[init_index++] = (xmlChar *)s;
            else {
                xmlFree(strings);
                PyErr_SetString(PyExc_TypeError,
                                "must be a tuple or list of strings.");
                return -1;
            }
        }
    }

    *result = strings;
    return 0;
}